

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::WindowDataParameter::WindowDataParameter(WindowDataParameter *this,WindowDataParameter *from)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint32 uVar5;
  uint32 uVar6;
  bool bVar7;
  bool bVar8;
  undefined2 uVar9;
  uint32 uVar10;
  uint uVar11;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__WindowDataParameter_00762110;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar11 = (from->_has_bits_).has_bits_[0];
  if ((uVar11 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->source_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->source_).ptr_);
    uVar11 = (from->_has_bits_).has_bits_[0];
  }
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar11 & 2) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->mean_file_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->mean_file_).ptr_);
    uVar11 = (from->_has_bits_).has_bits_[0];
  }
  (this->crop_mode_).ptr_ = (string *)&_default_crop_mode__abi_cxx11_;
  if ((uVar11 & 4) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->crop_mode_,(string *)&_default_crop_mode__abi_cxx11_,(from->crop_mode_).ptr_);
    uVar11 = (from->_has_bits_).has_bits_[0];
  }
  (this->root_folder_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar11 & 8) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->root_folder_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->root_folder_).ptr_);
  }
  uVar5 = from->batch_size_;
  uVar6 = from->crop_size_;
  bVar7 = from->mirror_;
  bVar8 = from->cache_images_;
  uVar9 = *(undefined2 *)&from->field_0x42;
  uVar10 = from->context_pad_;
  fVar2 = from->fg_threshold_;
  fVar3 = from->bg_threshold_;
  fVar4 = from->fg_fraction_;
  this->scale_ = from->scale_;
  this->fg_threshold_ = fVar2;
  this->bg_threshold_ = fVar3;
  this->fg_fraction_ = fVar4;
  this->batch_size_ = uVar5;
  this->crop_size_ = uVar6;
  this->mirror_ = bVar7;
  this->cache_images_ = bVar8;
  *(undefined2 *)&this->field_0x42 = uVar9;
  this->context_pad_ = uVar10;
  return;
}

Assistant:

WindowDataParameter::WindowDataParameter(const WindowDataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source()) {
    source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
  }
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_mean_file()) {
    mean_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.mean_file_);
  }
  crop_mode_.UnsafeSetDefault(&WindowDataParameter::_default_crop_mode_.get());
  if (from.has_crop_mode()) {
    crop_mode_.AssignWithDefault(&WindowDataParameter::_default_crop_mode_.get(), from.crop_mode_);
  }
  root_folder_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_root_folder()) {
    root_folder_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.root_folder_);
  }
  ::memcpy(&batch_size_, &from.batch_size_,
    reinterpret_cast<char*>(&fg_fraction_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(fg_fraction_));
  // @@protoc_insertion_point(copy_constructor:caffe.WindowDataParameter)
}